

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.hxx
# Opt level: O3

string * trim(string *str)

{
  char *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  size_type sVar6;
  pointer pcVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  size_type sVar11;
  pointer pcVar12;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar6 = str->_M_string_length;
  sVar11 = sVar6;
  if (0 < (long)sVar6 >> 2) {
    sVar11 = (size_type)((uint)sVar6 & 3);
    lVar8 = ((long)sVar6 >> 2) + 1;
    do {
      iVar5 = isspace((int)pcVar2[sVar6 - 1]);
      if (iVar5 == 0) {
        pcVar7 = pcVar2 + sVar6;
        goto LAB_001040f0;
      }
      iVar5 = isspace((int)pcVar2[sVar6 - 2]);
      if (iVar5 == 0) {
        pcVar7 = pcVar2 + (sVar6 - 1);
        goto LAB_001040f0;
      }
      iVar5 = isspace((int)pcVar2[sVar6 - 3]);
      if (iVar5 == 0) {
        pcVar7 = pcVar2 + (sVar6 - 2);
        goto LAB_001040f0;
      }
      iVar5 = isspace((int)pcVar2[sVar6 - 4]);
      if (iVar5 == 0) {
        pcVar7 = pcVar2 + (sVar6 - 3);
        goto LAB_001040f0;
      }
      sVar6 = sVar6 - 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  pcVar12 = pcVar2 + sVar11;
  lVar8 = (long)pcVar12 - (long)pcVar2;
  if (lVar8 == 1) {
LAB_001040be:
    iVar5 = isspace((int)pcVar12[-1]);
    pcVar7 = pcVar12;
    if (iVar5 != 0) {
      pcVar7 = pcVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_001040aa:
    iVar5 = isspace((int)pcVar12[-1]);
    pcVar7 = pcVar12;
    if (iVar5 != 0) {
      pcVar12 = pcVar12 + -1;
      goto LAB_001040be;
    }
  }
  else {
    pcVar7 = pcVar2;
    if ((lVar8 == 3) && (iVar5 = isspace((int)pcVar12[-1]), pcVar7 = pcVar12, iVar5 != 0)) {
      pcVar12 = pcVar12 + -1;
      goto LAB_001040aa;
    }
  }
LAB_001040f0:
  str->_M_string_length = (long)pcVar7 - (long)pcVar2;
  *pcVar7 = '\0';
  pcVar3 = (str->_M_dataplus)._M_p;
  uVar4 = str->_M_string_length;
  pcVar1 = pcVar3 + uVar4;
  pcVar9 = pcVar3;
  if (0 < (long)uVar4 >> 2) {
    pcVar9 = pcVar3 + (uVar4 & 0xfffffffffffffffc);
    lVar8 = ((long)uVar4 >> 2) + 1;
    pcVar10 = pcVar3 + 3;
    do {
      iVar5 = isspace((int)pcVar10[-3]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_001041d0;
      }
      iVar5 = isspace((int)pcVar10[-2]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_001041d0;
      }
      iVar5 = isspace((int)pcVar10[-1]);
      if (iVar5 == 0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_001041d0;
      }
      iVar5 = isspace((int)*pcVar10);
      if (iVar5 == 0) goto LAB_001041d0;
      lVar8 = lVar8 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)pcVar1 - (long)pcVar9;
  if (lVar8 == 1) {
LAB_001041ac:
    iVar5 = isspace((int)*pcVar9);
    pcVar10 = pcVar9;
    if (iVar5 != 0) {
      pcVar10 = pcVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_0010419b:
    iVar5 = isspace((int)*pcVar9);
    pcVar10 = pcVar9;
    if (iVar5 != 0) {
      pcVar9 = pcVar9 + 1;
      goto LAB_001041ac;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_001041e7;
    iVar5 = isspace((int)*pcVar9);
    pcVar10 = pcVar9;
    if (iVar5 != 0) {
      pcVar9 = pcVar9 + 1;
      goto LAB_0010419b;
    }
  }
LAB_001041d0:
  if (pcVar1 != pcVar10) {
    std::__cxx11::string::_M_erase((ulong)str,0);
    return str;
  }
LAB_001041e7:
  str->_M_string_length = 0;
  *pcVar3 = '\0';
  return str;
}

Assistant:

static inline string & trim(string & str)
{
  return ltrim(rtrim(str));
}